

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O2

void __thiscall
pico_tree::internal::
list_pool_resource<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL>::
~list_pool_resource(list_pool_resource<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL>
                    *this)

{
  ~list_pool_resource(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

virtual ~list_pool_resource() { release(); }